

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd.cc
# Opt level: O2

int RIPEMD160_Final(uchar *md,RIPEMD160_CTX *c)

{
  uint *data;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = c->num;
  uVar4 = (ulong)uVar1;
  if (0x3f < uVar4) {
    __assert_fail("n < block_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/ripemd/../../crypto/fipsmodule/digest/md32_common.h"
                  ,0x83,
                  "void crypto_md32_final(crypto_md32_block_func, uint32_t *, uint8_t *, size_t, unsigned int *, uint32_t, uint32_t, int)"
                 );
  }
  data = c->data;
  uVar2 = c->Nl;
  uVar3 = c->Nh;
  *(undefined1 *)((long)data + uVar4) = 0x80;
  lVar5 = uVar4 + 1;
  if (uVar1 < 0x38) {
    if (lVar5 == 0x38) goto LAB_00151feb;
  }
  else {
    if (uVar1 != 0x3f) {
      memset((void *)(lVar5 + (long)data),0,0x3f - uVar4);
    }
    ripemd160_block_data_order(&c->A,(uint8_t *)data,1);
    lVar5 = 0;
  }
  memset((void *)(lVar5 + (long)data),0,0x38 - lVar5);
LAB_00151feb:
  c->data[0xe] = uVar2;
  c->data[0xf] = uVar3;
  ripemd160_block_data_order(&c->A,(uint8_t *)data,1);
  c->data[0xc] = 0;
  c->data[0xd] = 0;
  c->data[0xe] = 0;
  c->data[0xf] = 0;
  c->data[8] = 0;
  c->data[9] = 0;
  c->data[10] = 0;
  c->data[0xb] = 0;
  c->data[4] = 0;
  c->data[5] = 0;
  c->data[6] = 0;
  c->data[7] = 0;
  data[0] = 0;
  data[1] = 0;
  c->data[2] = 0;
  c->data[3] = 0;
  c->num = 0;
  *(uint *)md = c->A;
  *(uint *)(md + 4) = c->B;
  *(uint *)(md + 8) = c->C;
  *(uint *)(md + 0xc) = c->D;
  *(uint *)(md + 0x10) = c->E;
  return 1;
}

Assistant:

int RIPEMD160_Final(uint8_t out[RIPEMD160_DIGEST_LENGTH], RIPEMD160_CTX *c) {
  crypto_md32_final(&ripemd160_block_data_order, c->h, c->data,
                    RIPEMD160_CBLOCK, &c->num, c->Nh, c->Nl,
                    /*is_big_endian=*/0);

  CRYPTO_store_u32_le(out, c->h[0]);
  CRYPTO_store_u32_le(out + 4, c->h[1]);
  CRYPTO_store_u32_le(out + 8, c->h[2]);
  CRYPTO_store_u32_le(out + 12, c->h[3]);
  CRYPTO_store_u32_le(out + 16, c->h[4]);
  return 1;
}